

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O1

int ddUpdateMtrTree(DdManager *table,MtrNode *treenode,int *perm,int *invperm)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *invperm_00;
  MtrHalfWord MVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  MtrHalfWord *pMVar8;
  
  iVar5 = 1;
  if (treenode != (MtrNode *)0x0) {
    uVar6 = treenode->low;
    uVar1 = treenode->size + uVar6;
    iVar3 = 0;
    if (uVar6 < uVar1) {
      pMVar8 = (MtrHalfWord *)(table->invperm + (int)uVar6);
      invperm_00 = (int *)0x7fffffff;
      uVar7 = 0;
      MVar4 = 0xffffffff;
      do {
        uVar2 = perm[(int)*pMVar8];
        if ((int)uVar2 < (int)invperm_00) {
          invperm_00 = (int *)(ulong)uVar2;
          MVar4 = *pMVar8;
        }
        if ((int)uVar7 < (int)uVar2) {
          uVar7 = uVar2;
        }
        pMVar8 = pMVar8 + 1;
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar1);
    }
    else {
      MVar4 = 0xffffffff;
      invperm_00 = (int *)0x7fffffff;
      uVar7 = 0;
    }
    iVar5 = 0;
    if ((MVar4 != 0xffffffff) &&
       (iVar5 = iVar3, (uVar7 - (MtrHalfWord)invperm_00) + 1 == treenode->size)) {
      treenode->low = (MtrHalfWord)invperm_00;
      treenode->index = MVar4;
      if (((treenode->child == (MtrNode *)0x0) ||
          (iVar3 = ddUpdateMtrTree(table,treenode->child,perm,invperm_00), iVar3 != 0)) &&
         ((treenode->younger == (MtrNode *)0x0 ||
          (iVar3 = ddUpdateMtrTree(table,treenode->younger,perm,invperm_00), iVar3 != 0)))) {
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

static int
ddUpdateMtrTree(
  DdManager * table,
  MtrNode * treenode,
  int * perm,
  int * invperm)
{
    int i, size;
    int index, level, minLevel, maxLevel, minIndex;

    if (treenode == NULL) return(1);

    minLevel = CUDD_MAXINDEX;
    maxLevel = 0;
    minIndex = -1;
    /* i : level */
    for (i = treenode->low; i < treenode->low + treenode->size; i++) {
        index = table->invperm[i];
        level = perm[index];
        if (level < minLevel) {
            minLevel = level;
            minIndex = index;
        }
        if (level > maxLevel)
            maxLevel = level;
    }
    size = maxLevel - minLevel + 1;
    if (minIndex == -1) return(0);
    if (size == treenode->size) {
        treenode->low = minLevel;
        treenode->index = minIndex;
    } else {
        return(0);
    }

    if (treenode->child != NULL) {
        if (!ddUpdateMtrTree(table, treenode->child, perm, invperm))
            return(0);
    }
    if (treenode->younger != NULL) {
        if (!ddUpdateMtrTree(table, treenode->younger, perm, invperm))
            return(0);
    }
    return(1);
}